

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedOffsetTable.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_orderedOffsetTableBuilder_finish(sysbvm_context_t *context,sysbvm_tuple_t builder)

{
  size_t sVar1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  
  sVar1 = sysbvm_orderedCollection_getSize(*(sysbvm_tuple_t *)(builder + 0x10));
  if (sVar1 == 0) {
    psVar2 = (sysbvm_object_tuple_t *)0x0;
  }
  else {
    psVar2 = sysbvm_context_allocatePointerTuple(context,(context->roots).orderedOffsetTableType,2);
    sVar3 = sysbvm_orderedCollection_asWordArray(context,*(sysbvm_tuple_t *)(builder + 0x10));
    (psVar2->field_1).pointers[0] = sVar3;
    sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(builder + 0x18));
    psVar2[1].header.field_0.typePointer = sVar3;
  }
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedOffsetTableBuilder_finish(sysbvm_context_t *context, sysbvm_tuple_t builder)
{
    sysbvm_orderedOffsetTableBuilder_t *builderObject = (sysbvm_orderedOffsetTableBuilder_t*)builder;
    size_t size = sysbvm_orderedCollection_getSize(builderObject->keys);
    if(!size)
        return SYSBVM_NULL_TUPLE;

    sysbvm_orderedOffsetTable_t *result = (sysbvm_orderedOffsetTable_t*)sysbvm_context_allocatePointerTuple(context, context->roots.orderedOffsetTableType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_orderedOffsetTable_t));
    result->keys = sysbvm_orderedCollection_asWordArray(context, builderObject->keys);
    result->values = sysbvm_orderedCollection_asArray(context, builderObject->values);
    return (sysbvm_tuple_t)result;
}